

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::ZEbasic_leakChecker
          (ZEbasic_leakChecker *this)

{
  bool bVar1;
  reference this_00;
  reference pbVar2;
  __atomic_base<long> *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ctorsAndDtors *s;
  iterator __end1;
  iterator __begin1;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  *__range1;
  undefined1 local_28 [8];
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> set;
  ZEbasic_leakChecker *this_local;
  
  set.
  super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ZEValidationEntryPoints::ZEValidationEntryPoints(&this->super_ZEValidationEntryPoints);
  (this->super_ZEValidationEntryPoints)._vptr_ZEValidationEntryPoints =
       (_func_int **)&PTR_zeInitPrologue_00318b40;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
  ::unordered_map(&this->counts);
  createDestroySet();
  __end1 = std::
           vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
           ::begin((vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
                    *)local_28);
  s = (ctorsAndDtors *)
      std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
      ::end((vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
             *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<validation_layer::ctorsAndDtors_*,_std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>_>
                                *)&s);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<validation_layer::ctorsAndDtors_*,_std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>_>
              ::operator*(&__end1);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this_00->ctors);
    name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this_00->ctors);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&name);
      if (!bVar1) break;
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      p_Var3 = &std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
                ::operator[](&this->counts,pbVar2)->super___atomic_base<long>;
      std::__atomic_base<long>::operator=(p_Var3,0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this_00->dtors);
    name_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this_00->dtors);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&name_1);
      if (!bVar1) break;
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2_1);
      p_Var3 = &std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
                ::operator[](&this->counts,pbVar2)->super___atomic_base<long>;
      std::__atomic_base<long>::operator=(p_Var3,0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<validation_layer::ctorsAndDtors_*,_std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>_>
    ::operator++(&__end1);
  }
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  ~vector((vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
           *)local_28);
  return;
}

Assistant:

basic_leakChecker::ZEbasic_leakChecker::ZEbasic_leakChecker() {
        // initialize counts for all functions that should be tracked
        auto set = createDestroySet();
        for (const auto &s : set) {
            for (auto &name : s.ctors) {
                counts[name] = 0;
            }
            for (auto &name : s.dtors) {
                counts[name] = 0;
            }
        }
    }